

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

int xc_functional_get_number(char *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xc_functional_key_t *__s1;
  
  iVar2 = strncasecmp(name,"XC_",3);
  __s1 = xc_functional_keys;
  do {
    iVar1 = __s1->number;
    if (iVar1 == -1) {
      return -1;
    }
    iVar3 = strcasecmp(__s1->name,name + (ulong)(iVar2 == 0) * 3);
    __s1 = __s1 + 1;
  } while (iVar3 != 0);
  return iVar1;
}

Assistant:

int xc_functional_get_number(const char *name)
{
  int ii;
  int key=-1;
  const char *p;

  /* Does name begin with xc_? */
  if(strncasecmp(name,"XC_",3) == 0) {
    p=name+3;
  } else {
    p=name;
  }

  for(ii=0;;ii++){
    if(xc_functional_keys[ii].number == -1)
      break;
    if(strcasecmp(xc_functional_keys[ii].name, p) == 0){
      key = xc_functional_keys[ii].number;
      break;
    }
  }

  return key;
}